

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesFrequencyOcSetIccMax(zes_freq_handle_t hFrequency,double ocIccMax)

{
  zes_pfnFrequencyOcSetIccMax_t pfnOcSetIccMax;
  ze_result_t result;
  double ocIccMax_local;
  zes_freq_handle_t hFrequency_local;
  
  pfnOcSetIccMax._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cc80 != (code *)0x0) {
    pfnOcSetIccMax._4_4_ = (*DAT_0011cc80)(ocIccMax,hFrequency);
  }
  return pfnOcSetIccMax._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFrequencyOcSetIccMax(
        zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
        double ocIccMax                                 ///< [in] The new maximum current limit in Amperes.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnOcSetIccMax = context.zesDdiTable.Frequency.pfnOcSetIccMax;
        if( nullptr != pfnOcSetIccMax )
        {
            result = pfnOcSetIccMax( hFrequency, ocIccMax );
        }
        else
        {
            // generic implementation
        }

        return result;
    }